

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MulticastSocket.cpp
# Opt level: O3

int __thiscall JetHead::MulticastSocket::setBroadcast(MulticastSocket *this,bool enable)

{
  int iVar1;
  undefined7 in_register_00000031;
  int option;
  undefined4 local_c;
  
  local_c = (undefined4)CONCAT71(in_register_00000031,enable);
  iVar1 = setsockopt((this->super_ServerSocket).super_Socket.mFd,1,6,&local_c,4);
  if (iVar1 != 0) {
    jh_log_print(1,"int JetHead::MulticastSocket::setBroadcast(bool)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/MulticastSocket.cpp"
                 ,0xa3,"Set broadcast failed");
  }
  return iVar1;
}

Assistant:

int MulticastSocket::setBroadcast(bool enable)
{
	int option = enable ? 1 : 0;
	int ret = setsockopt(getFd(),
						 SOL_SOCKET,
						 SO_BROADCAST,
						 &option,
						 sizeof(option));
	if (ret)
	{
		LOG_ERR_PERROR("Set broadcast failed");
	}
	return ret;						 
}